

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oop_interface.hpp
# Opt level: O3

void __thiscall isotree::IsolationForest::~IsolationForest(IsolationForest *this)

{
  pointer piVar1;
  pointer pdVar2;
  
  std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::~vector(&(this->indexer).indices);
  piVar1 = (this->imputer).col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->imputer).col_modes.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  pdVar2 = (this->imputer).col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->imputer).col_means.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector(&(this->imputer).imputer_tree);
  piVar1 = (this->imputer).ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->imputer).ncat.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  std::
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ::~vector(&(this->model_ext).hplanes);
  std::
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  ::~vector(&(this->model).trees);
  return;
}

Assistant:

~IsolationForest() = default;